

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

int __thiscall dnet::data_types::tensor<int,_3U>::init(tensor<int,_3U> *this,EVP_PKEY_CTX *ctx)

{
  index_type i;
  uint uVar1;
  int extraout_EAX;
  long lVar2;
  
  lVar2 = 0;
  do {
    (this->_axes_sort)._M_elems[lVar2] = (uint)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  uVar1 = 1;
  lVar2 = 0;
  do {
    (this->_facts)._M_elems[lVar2 + 2] = uVar1;
    uVar1 = uVar1 * *(int *)(ctx + lVar2 * 4 + 8);
    lVar2 = lVar2 + -1;
  } while (lVar2 != -3);
  std::vector<int,_std::allocator<int>_>::resize(&this->_data,(ulong)uVar1);
  return extraout_EAX;
}

Assistant:

void tensor<T, N>::init(const std::array<index_type, N> &sizes)
        {
            for (index_type i = 0; i < this->_axes_sort.size(); i++) {
                _axes_sort[i] = i;
            }
            index_type fact = 1;
            for (int i = N - 1; i >= 0; i--) {
                this->_facts[i] = fact;
                fact *= sizes[i];
            }
            this->_data.resize(fact);
        }